

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall MCU::zigzag(MCU *this)

{
  int local_138;
  int local_134;
  int j_1;
  int i_1;
  int j;
  int i;
  int zz [8] [8];
  int local_1c;
  int local_18;
  int w;
  int h;
  int id;
  MCU *this_local;
  
  for (w = 1; w < 4; w = w + 1) {
    for (local_18 = 0; local_18 < (int)(uint)subVector[w].height; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < (int)(uint)subVector[w].width; local_1c = local_1c + 1) {
        memcpy(&j,&DAT_0010c160,0x100);
        for (i_1 = 0; i_1 < 8; i_1 = i_1 + 1) {
          for (j_1 = 0; j_1 < 8; j_1 = j_1 + 1) {
            (&j)[(long)i_1 * 8 + (long)j_1] =
                 (int)this->mcu[w][local_18][local_1c][(&j)[(long)i_1 * 8 + (long)j_1] / 8]
                      [(&j)[(long)i_1 * 8 + (long)j_1] % 8];
          }
        }
        for (local_134 = 0; local_134 < 8; local_134 = local_134 + 1) {
          for (local_138 = 0; local_138 < 8; local_138 = local_138 + 1) {
            this->mcu[w][local_18][local_1c][local_134][local_138] =
                 (double)(&j)[(long)local_134 * 8 + (long)local_138];
          }
        }
      }
    }
  }
  return;
}

Assistant:

void zigzag() {
        for (int id = 1; id <= 3; id++) {
            for (int h = 0; h < subVector[id].height; h++) {
                for (int w = 0; w < subVector[id].width; w++) {
                    int zz[8][8] = {
                            { 0,  1,  5,  6, 14, 15, 27, 28},
                            { 2,  4,  7, 13, 16, 26, 29, 42},
                            { 3,  8, 12, 17, 25, 30, 41, 43},
                            { 9, 11, 18, 24, 31, 40, 44, 53},
                            {10, 19, 23, 32, 39, 45, 52, 54},
                            {20, 22, 33, 38, 46, 51, 55, 60},
                            {21, 34, 37, 47, 50, 56, 59, 61},
                            {35, 36, 48, 49, 57, 58, 62, 63}
                    };
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            zz[i][j] = mcu[id][h][w][zz[i][j] / 8][zz[i][j] % 8];
                        }
                    }
                    for (int i = 0; i < 8; i++) {
                        for (int j = 0; j < 8; j++) {
                            mcu[id][h][w][i][j] = zz[i][j];
                        }
                    }
                }
            }
        }
    }